

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vtab_rhs_value(sqlite3_index_info *pIdxInfo,int iCons,sqlite3_value **ppVal)

{
  int iVar1;
  WhereTerm *pWVar2;
  int iVar3;
  sqlite3_value *psVar4;
  
  if ((iCons < 0) || (pIdxInfo->nConstraint <= iCons)) {
    iVar1 = sqlite3MisuseError(0x28fcc);
    psVar4 = (sqlite3_value *)0x0;
  }
  else {
    psVar4 = (sqlite3_value *)(&pIdxInfo[1].aConstraintUsage)[(uint)iCons];
    iVar1 = 0;
    if (psVar4 == (sqlite3_value *)0x0) {
      pWVar2 = termFromWhereClause(*(WhereClause **)(pIdxInfo + 1),
                                   pIdxInfo->aConstraint[(uint)iCons].iTermOffset);
      iVar1 = sqlite3ValueFromExpr
                        (*(sqlite3 **)pIdxInfo[1].aConstraint,pWVar2->pExpr->pRight,
                         (*(sqlite3 **)pIdxInfo[1].aConstraint)->enc,'A',
                         (sqlite3_value **)(&pIdxInfo[1].aConstraintUsage + (uint)iCons));
      psVar4 = (sqlite3_value *)(&pIdxInfo[1].aConstraintUsage)[(uint)iCons];
    }
  }
  *ppVal = psVar4;
  iVar3 = 0xc;
  if (psVar4 != (sqlite3_value *)0x0) {
    iVar3 = iVar1;
  }
  if (iVar1 != 0) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_vtab_rhs_value(
  sqlite3_index_info *pIdxInfo,   /* Copy of first argument to xBestIndex */
  int iCons,                      /* Constraint for which RHS is wanted */
  sqlite3_value **ppVal           /* Write value extracted here */
){
  HiddenIndexInfo *pH = (HiddenIndexInfo*)&pIdxInfo[1];
  sqlite3_value *pVal = 0;
  int rc = SQLITE_OK;
  if( iCons<0 || iCons>=pIdxInfo->nConstraint ){
    rc = SQLITE_MISUSE_BKPT; /* EV: R-30545-25046 */
  }else{
    if( pH->aRhs[iCons]==0 ){
      WhereTerm *pTerm = termFromWhereClause(
          pH->pWC, pIdxInfo->aConstraint[iCons].iTermOffset
      );
      rc = sqlite3ValueFromExpr(
          pH->pParse->db, pTerm->pExpr->pRight, ENC(pH->pParse->db),
          SQLITE_AFF_BLOB, &pH->aRhs[iCons]
      );
      testcase( rc!=SQLITE_OK );
    }
    pVal = pH->aRhs[iCons];
  }
  *ppVal = pVal;

  if( rc==SQLITE_OK && pVal==0 ){  /* IMP: R-19933-32160 */
    rc = SQLITE_NOTFOUND;          /* IMP: R-36424-56542 */
  }

  return rc;
}